

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O2

rt_function_error_t allocate_shift_local_context(rt_function_t *f)

{
  uint uVar1;
  undefined8 *puVar2;
  rt_variable_t *prVar3;
  rt_function_error_t rVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  rt_variable_getter p_Var8;
  rt_variable_setter p_Var9;
  void *pvVar10;
  code *pcVar11;
  int iVar12;
  uint uVar13;
  int i;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  rt_list_t src;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t rVar18;
  
  rVar4 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 1) &&
     (rVar4 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    piVar7 = (int *)(*rt_malloc_func)(0x70);
    if (piVar7 == (int *)0x0) {
      rVar4 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      puVar2 = (undefined8 *)f->local_context;
      *puVar2 = piVar7;
      rVar18._4_4_ = 0;
      rVar18.size = ((*f->inputs)->shape).size;
      rVar18.data = ((*f->inputs)->shape).data;
      rVar18 = clone_list(rVar18);
      *piVar7 = rVar18.size;
      *(int **)(piVar7 + 2) = rVar18.data;
      src._4_4_ = 0;
      src.size = ((*f->outputs)->shape).size;
      src.data = ((*f->outputs)->shape).data;
      rVar18 = clone_list(src);
      piVar7[4] = rVar18.size;
      *(int **)(piVar7 + 6) = rVar18.data;
      shape._4_4_ = 0;
      shape.size = ((*f->inputs)->shape).size;
      shape.data = ((*f->inputs)->shape).data;
      rVar18 = calc_contiguous_strides(shape);
      piVar7[8] = rVar18.size;
      *(int **)(piVar7 + 10) = rVar18.data;
      rVar18 = allocate_list(piVar7[4]);
      piVar7[0xc] = rVar18.size;
      *(int **)(piVar7 + 0xe) = rVar18.data;
      prVar3 = *f->inputs;
      *(rt_variable_t **)(piVar7 + 0x12) = prVar3;
      p_Var8 = select_getter(prVar3);
      *(rt_variable_getter *)(piVar7 + 0x14) = p_Var8;
      prVar3 = *f->outputs;
      *(rt_variable_t **)(piVar7 + 0x16) = prVar3;
      p_Var9 = select_setter(prVar3);
      *(rt_variable_setter *)(piVar7 + 0x18) = p_Var9;
      shape_00._4_4_ = 0;
      shape_00.size = **(uint **)(piVar7 + 0x16);
      shape_00.data = *(int **)(*(uint **)(piVar7 + 0x16) + 2);
      iVar5 = calc_shape_size(shape_00);
      piVar7[0x1a] = iVar5;
      pvVar10 = (*rt_malloc_func)((long)*piVar7 << 3);
      *(void **)(piVar7 + 0x10) = pvVar10;
      for (lVar14 = 0; lVar14 < *piVar7; lVar14 = lVar14 + 1) {
        iVar5 = *(int *)(*(long *)(piVar7 + 10) + lVar14 * 4);
        uVar1 = *(uint *)(*(long *)(piVar7 + 2) + lVar14 * 4);
        pvVar10 = (*rt_malloc_func)((long)(int)uVar1 * 4);
        *(void **)(*(long *)(piVar7 + 0x10) + lVar14 * 8) = pvVar10;
        uVar6 = (int)lVar14 + (*(int *)(puVar2 + 1) - *piVar7);
        if ((int)uVar6 < 0) {
          iVar12 = 0;
        }
        else {
          iVar12 = -*(int *)(puVar2[2] + (ulong)uVar6 * 4);
        }
        if (*(int *)(puVar2 + 3) == 1) {
          uVar16 = 0;
          if (0 < (int)uVar1) {
            uVar16 = (ulong)uVar1;
          }
          for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
            uVar6 = 0;
            if (1 < (int)uVar1) {
              uVar13 = iVar12 + uVar1 * 2 + (int)uVar17;
              uVar6 = -uVar13;
              if (0 < (int)uVar13) {
                uVar6 = uVar13;
              }
              uVar6 = uVar6 % (uVar1 * 2);
            }
            uVar13 = ~uVar6 + uVar1 * 2;
            if ((int)uVar6 < (int)uVar1) {
              uVar13 = uVar6;
            }
            *(uint *)(*(long *)(*(long *)(piVar7 + 0x10) + lVar14 * 8) + uVar17 * 4) =
                 uVar13 * iVar5;
          }
        }
        else {
          uVar16 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar16 = 0;
          }
          for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
            iVar15 = iVar12 + (int)uVar17;
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            if ((int)(uVar1 - 1) <= iVar15) {
              iVar15 = uVar1 - 1;
            }
            *(int *)(*(long *)(*(long *)(piVar7 + 0x10) + lVar14 * 8) + uVar17 * 4) = iVar15 * iVar5
            ;
          }
        }
      }
      if (((*(byte *)(*(long *)(piVar7 + 0x12) + 0x10) & 0xf) == 0) &&
         ((*(byte *)(*(long *)(piVar7 + 0x16) + 0x10) & 0xf) == 0)) {
        pcVar11 = exec_shift;
      }
      else {
        pcVar11 = exec_shift_generic;
      }
      f->exec_func = pcVar11;
      rVar4 = RT_FUNCTION_ERROR_NOERROR;
    }
  }
  return rVar4;
}

Assistant:

rt_function_error_t allocate_shift_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  shift_private_t *p = rt_malloc_func(sizeof(shift_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  shift_local_context_t *context = (shift_local_context_t *)(f->local_context);
  ((shift_local_context_t *)(f->local_context))->data = (void *)p;
  p->input_shape = clone_list(f->inputs[0]->shape);
  p->output_shape = clone_list(f->outputs[0]->shape);
  p->input_strides = calc_contiguous_strides(f->inputs[0]->shape);
  p->out_position = allocate_list(p->output_shape.size);
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);
  p->output = f->outputs[0];
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(p->output->shape);

  p->table = rt_malloc_func(sizeof(int *) * p->input_shape.size);

  for (int i = 0; i < p->input_shape.size; i++) {
    const int stride = p->input_strides.data[i];
    const int size = p->input_shape.data[i];
    p->table[i] = rt_malloc_func(size * sizeof(int));
    const int shift_index = context->shifts.size - p->input_shape.size + i;
    const int shift = shift_index >= 0 ? -context->shifts.data[shift_index] : 0;

    if (context->border_mode == SHIFT_BORDER_MODE_REFLECT) {
      for (int j = 0; j < size; j++) {
        const int a = size > 1 ? (abs(j + size * 2 + shift) % (size * 2)) : 0;
        p->table[i][j] = (a >= size ? (size * 2) - 1 - a : a) * stride;
      }
    } else {
      for (int j = 0; j < size; j++) {
        p->table[i][j] = MIN(MAX(j + shift, 0), size - 1) * stride;
      }
    }
  }
  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_SHIFT_FLOAT32
    f->exec_func = exec_shift;
#endif /* CONFIG_SHIFT_FLOAT32 */
  } else {
#ifdef CONFIG_SHIFT_GENERIC
    f->exec_func = exec_shift_generic;
#endif /* CONFIG_SHIFT_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}